

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search_fwdtree.c
# Opt level: O2

int ngram_fwdtree_search(ngram_search_t *ngs,int frame_idx)

{
  short sVar1;
  short sVar2;
  s3ssid_t sVar3;
  uint16 uVar4;
  uint uVar5;
  dictword_t *pdVar6;
  chan_t ***pppcVar7;
  chan_t *h;
  bitvec_t *pbVar8;
  int32 **ppiVar9;
  chan_s *pcVar10;
  dict_t *pdVar11;
  bin_mdef_t *pbVar12;
  xwdssid_t *pxVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int16 *piVar17;
  int32 *piVar18;
  anon_union_4_2_fc8632de_for_info *paVar19;
  cand_sf_t *pcVar20;
  int iVar21;
  chan_t **ppcVar22;
  last_ltrans_t *plVar23;
  lastphn_cand_t *plVar24;
  int iVar25;
  uint *puVar26;
  ps_search_t *ppVar27;
  root_chan_t *prVar28;
  int iVar29;
  int iVar30;
  ulong uVar31;
  acmod_t *acmod;
  ulong uVar32;
  int iVar33;
  int iVar34;
  int *piVar35;
  long lVar36;
  chan_t **ppcVar37;
  bptbl_t *pbVar38;
  hmm_t *phVar39;
  chan_s **ppcVar40;
  long lVar41;
  uint uVar42;
  int32 iVar43;
  long lVar44;
  chan_t *pcVar45;
  lastphn_cand_t *plVar46;
  int32 iVar47;
  bestbp_rc_t *pbVar48;
  bool bVar49;
  uint *local_490;
  uint *local_480;
  chan_t **local_478;
  int frame_idx_local;
  ulong local_468;
  ps_search_t *local_460;
  dict2pid_t *local_458;
  ulong local_450;
  uint *local_448;
  ulong local_440;
  int32 local_438 [258];
  
  acmod = (ngs->base).acmod;
  frame_idx_local = frame_idx;
  if (acmod->compallsen == '\0') {
    acmod_clear_active(acmod);
    prVar28 = ngs->root_chan;
    for (iVar47 = ngs->n_root_chan; 0 < iVar47; iVar47 = iVar47 + -1) {
      if ((prVar28->hmm).frame == frame_idx) {
        acmod_activate_hmm((ngs->base).acmod,&prVar28->hmm);
      }
      prVar28 = prVar28 + 1;
    }
    uVar42 = frame_idx & 1;
    ppcVar22 = ngs->active_chan_list[uVar42];
    for (iVar47 = ngs->n_active_chan[uVar42]; 0 < iVar47; iVar47 = iVar47 + -1) {
      pcVar45 = *ppcVar22;
      ppcVar22 = ppcVar22 + 1;
      acmod_activate_hmm((ngs->base).acmod,&pcVar45->hmm);
    }
    piVar35 = ngs->active_word_list[uVar42];
    for (iVar47 = ngs->n_active_word[uVar42]; 0 < iVar47; iVar47 = iVar47 + -1) {
      iVar16 = *piVar35;
      piVar35 = piVar35 + 1;
      for (phVar39 = (hmm_t *)(ngs->word_chan + iVar16); phVar39 = (hmm_t *)phVar39->ctx,
          phVar39 != (hmm_t *)0x0; phVar39 = phVar39 + 1) {
        acmod_activate_hmm((ngs->base).acmod,phVar39);
      }
    }
    for (lVar44 = 0; lVar44 < ngs->n_1ph_words; lVar44 = lVar44 + 1) {
      if ((ngs->word_chan[ngs->single_phone_wid[lVar44]]->hmm).frame == frame_idx) {
        acmod_activate_hmm((ngs->base).acmod,&ngs->word_chan[ngs->single_phone_wid[lVar44]]->hmm);
      }
    }
    acmod = (ngs->base).acmod;
  }
  piVar17 = acmod_score(acmod,&frame_idx_local);
  iVar16 = 0;
  if (piVar17 != (int16 *)0x0) {
    piVar18 = &(ngs->st).n_senone_active_utt;
    *piVar18 = *piVar18 + ((ngs->base).acmod)->n_senone_active;
    ngram_search_mark_bptable(ngs,frame_idx_local);
    if (-0x20000000 < ngs->best_score) {
      if (ngs->best_score + ngs->beam * 2 < -0x20000000) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                ,0x5c5,"Renormalizing Scores at frame %d, best score %d\n",
                (ulong)(uint)frame_idx_local);
        iVar16 = frame_idx_local;
        iVar47 = ngs->best_score;
        prVar28 = ngs->root_chan;
        for (iVar43 = ngs->n_root_chan; 0 < iVar43; iVar43 = iVar43 + -1) {
          if ((prVar28->hmm).frame == iVar16) {
            hmm_normalize(&prVar28->hmm,iVar47);
          }
          prVar28 = prVar28 + 1;
        }
        uVar42 = iVar16 & 1;
        ppcVar22 = ngs->active_chan_list[uVar42];
        for (iVar43 = ngs->n_active_chan[uVar42]; 0 < iVar43; iVar43 = iVar43 + -1) {
          pcVar45 = *ppcVar22;
          ppcVar22 = ppcVar22 + 1;
          hmm_normalize(&pcVar45->hmm,iVar47);
        }
        piVar35 = ngs->active_word_list[uVar42];
        for (iVar43 = ngs->n_active_word[uVar42]; 0 < iVar43; iVar43 = iVar43 + -1) {
          iVar33 = *piVar35;
          piVar35 = piVar35 + 1;
          for (phVar39 = (hmm_t *)(ngs->word_chan + iVar33); phVar39 = (hmm_t *)phVar39->ctx,
              phVar39 != (hmm_t *)0x0; phVar39 = phVar39 + 1) {
            hmm_normalize(phVar39,iVar47);
          }
        }
        for (lVar44 = 0; lVar44 < ngs->n_1ph_words; lVar44 = lVar44 + 1) {
          if ((ngs->word_chan[ngs->single_phone_wid[lVar44]]->hmm).frame == iVar16) {
            hmm_normalize(&ngs->word_chan[ngs->single_phone_wid[lVar44]]->hmm,iVar47);
          }
        }
        ngs->renormalized = 1;
      }
      iVar16 = frame_idx_local;
      ngs->hmmctx->senscore = piVar17;
      prVar28 = ngs->root_chan;
      iVar33 = -0x20000000;
      for (iVar47 = ngs->n_root_chan; 0 < iVar47; iVar47 = iVar47 + -1) {
        if ((prVar28->hmm).frame == iVar16) {
          iVar43 = hmm_vit_eval(&prVar28->hmm);
          if (iVar33 < iVar43) {
            iVar33 = iVar43;
          }
          piVar18 = &(ngs->st).n_root_chan_eval;
          *piVar18 = *piVar18 + 1;
        }
        prVar28 = prVar28 + 1;
      }
      ngs->best_score = iVar33;
      local_468 = (ulong)(iVar16 & 1);
      iVar33 = ngs->n_active_chan[local_468];
      ppcVar22 = ngs->active_chan_list[local_468];
      piVar18 = &(ngs->st).n_nonroot_chan_eval;
      *piVar18 = *piVar18 + iVar33;
      iVar34 = -0x20000000;
      for (; 0 < iVar33; iVar33 = iVar33 + -1) {
        pcVar45 = *ppcVar22;
        iVar47 = hmm_vit_eval(&pcVar45->hmm);
        if ((pcVar45->hmm).frame != iVar16) {
          __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x27c,"int32 eval_nonroot_chan(ngram_search_t *, int)");
        }
        ppcVar22 = ppcVar22 + 1;
        if (iVar34 < iVar47) {
          iVar34 = iVar47;
        }
      }
      if (ngs->best_score < iVar34) {
        ngs->best_score = iVar34;
      }
      local_490 = (uint *)ngs->active_word_list[local_468];
      iVar34 = 0;
      iVar33 = -0x20000000;
      for (iVar47 = ngs->n_active_word[local_468]; 0 < iVar47; iVar47 = iVar47 + -1) {
        uVar42 = *local_490;
        uVar5 = ngs->word_active[(int)uVar42 / 0x20];
        if ((uVar5 >> (uVar42 & 0x1f) & 1) == 0) {
          __assert_fail("bitvec_is_set(ngs->word_active, w)",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x291,"int32 eval_word_chan(ngram_search_t *, int)");
        }
        ngs->word_active[(int)uVar42 / 0x20] = uVar5 & ~(uint)(1L << ((byte)uVar42 & 0x1f));
        pcVar45 = ngs->word_chan[(int)uVar42];
        if (pcVar45 == (chan_t *)0x0) {
          __assert_fail("ngs->word_chan[w] != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x293,"int32 eval_word_chan(ngram_search_t *, int)");
        }
        local_490 = local_490 + 1;
        for (; pcVar45 != (chan_t *)0x0; pcVar45 = pcVar45->next) {
          if ((pcVar45->hmm).frame != iVar16) {
            __assert_fail("hmm_frame(&hmm->hmm) == frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x298,"int32 eval_word_chan(ngram_search_t *, int)");
          }
          iVar43 = hmm_vit_eval(&pcVar45->hmm);
          if (iVar33 < iVar43) {
            iVar33 = iVar43;
          }
          iVar34 = iVar34 + 1;
        }
      }
      iVar25 = 0;
      for (lVar44 = 0; iVar30 = frame_idx_local, lVar44 < ngs->n_1ph_words; lVar44 = lVar44 + 1) {
        iVar30 = ngs->single_phone_wid[lVar44];
        if (iVar16 <= (ngs->word_chan[iVar30]->hmm).frame) {
          iVar47 = hmm_vit_eval(&ngs->word_chan[iVar30]->hmm);
          if ((iVar33 < iVar47) && (iVar30 != (ngs->base).finish_wid)) {
            iVar33 = iVar47;
          }
          iVar25 = iVar25 + 1;
        }
      }
      piVar18 = &(ngs->st).n_last_chan_eval;
      *piVar18 = *piVar18 + iVar34 + iVar25;
      iVar34 = iVar34 + iVar25 + (ngs->st).n_nonroot_chan_eval;
      (ngs->st).n_nonroot_chan_eval = iVar34;
      piVar18 = &(ngs->st).n_word_lastchan_eval;
      *piVar18 = *piVar18 + iVar25 + ngs->n_active_word[local_468];
      iVar16 = ngs->best_score;
      if (ngs->best_score < iVar33) {
        ngs->best_score = iVar33;
        iVar16 = iVar33;
      }
      ngs->last_phone_best_score = iVar33;
      ngs->n_lastphn_cand = 0;
      iVar33 = ngs->beam;
      iVar25 = ngs->maxhmmpf;
      ngs->dynamic_beam = iVar33;
      if (iVar25 == -1) {
        prVar28 = ngs->root_chan;
      }
      else {
        prVar28 = ngs->root_chan;
        if (iVar25 < iVar34 + (ngs->st).n_root_chan_eval) {
          iVar33 = iVar33 / -0x100;
          memset(local_438,0,0x400);
          iVar34 = 0;
          if (0 < ngs->n_root_chan) {
            iVar34 = ngs->n_root_chan;
          }
          piVar18 = &(prVar28->hmm).bestscore;
          while (bVar49 = iVar34 != 0, iVar34 = iVar34 + -1, bVar49) {
            iVar14 = (iVar16 - *piVar18) / iVar33;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            local_438[iVar14] = local_438[iVar14] + 1;
            piVar18 = piVar18 + 0x1c;
          }
          ppcVar22 = ngs->active_chan_list[iVar30 & 1U];
          for (iVar34 = ngs->n_active_chan[iVar30 & 1U]; 0 < iVar34; iVar34 = iVar34 + -1) {
            iVar14 = (iVar16 - ((*ppcVar22)->hmm).bestscore) / iVar33;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            ppcVar22 = ppcVar22 + 1;
            local_438[iVar14] = local_438[iVar14] + 1;
          }
          iVar34 = 0;
          for (lVar44 = 0; lVar44 != 0x100; lVar44 = lVar44 + 1) {
            iVar34 = iVar34 + local_438[lVar44];
            if (iVar25 < iVar34) goto LAB_0013738f;
          }
          lVar44 = 0x100;
LAB_0013738f:
          iVar33 = -(iVar33 * (int)lVar44);
          ngs->dynamic_beam = iVar33;
        }
      }
      uVar42 = iVar30 + 1;
      iVar34 = ngs->pbeam + iVar16;
      iVar14 = iVar16 + ngs->lpbeam;
      ppVar27 = (ngs->base).pls;
      local_450 = (ulong)(uVar42 & 1);
      ppcVar22 = ngs->active_chan_list[local_450];
      local_468 = CONCAT44(local_468._4_4_,uVar42);
      local_460 = ppVar27;
      for (iVar25 = 0; iVar25 < ngs->n_root_chan; iVar25 = iVar25 + 1) {
        if ((iVar30 <= (prVar28->hmm).frame) && (iVar33 + iVar16 < (prVar28->hmm).bestscore)) {
          (prVar28->hmm).frame = uVar42;
          iVar29 = ngs->pip + (prVar28->hmm).out_score;
          if ((ppVar27 != (ps_search_t *)0x0) || (iVar34 < iVar29)) {
            local_458 = (dict2pid_t *)CONCAT44(local_458._4_4_,iVar29);
            ppcVar37 = &prVar28->next;
            while (pcVar45 = *ppcVar37, pcVar45 != (chan_t *)0x0) {
              if (ppVar27 == (ps_search_t *)0x0) {
                iVar15 = 0;
              }
              else {
                iVar15 = *(int *)((long)&(ppVar27[1].acmod)->config + (long)pcVar45->ciphone * 4);
              }
              if ((iVar34 < iVar15 + iVar29) &&
                 (((pcVar45->hmm).frame < iVar30 || ((pcVar45->hmm).score[0] < iVar29)))) {
                hmm_enter(&pcVar45->hmm,iVar29,(prVar28->hmm).out_history,(int)local_468);
                *ppcVar22 = pcVar45;
                ppcVar22 = ppcVar22 + 1;
                ppVar27 = local_460;
                iVar29 = (int)local_458;
              }
              ppcVar37 = &pcVar45->alt;
            }
          }
          if ((ppVar27 != (ps_search_t *)0x0) || (iVar14 < iVar29)) {
            piVar18 = &prVar28->penult_phn_wid;
            while( true ) {
              iVar15 = *piVar18;
              lVar44 = (long)iVar15;
              if (lVar44 < 0) break;
              if (ppVar27 == (ps_search_t *)0x0) {
                iVar21 = 0;
              }
              else {
                pdVar6 = ((ngs->base).dict)->word;
                iVar21 = *(int *)((long)&(ppVar27[1].acmod)->config +
                                 (long)pdVar6[lVar44].ciphone[(long)pdVar6[lVar44].pronlen + -1] * 4
                                 );
              }
              if (iVar14 < iVar21 + iVar29) {
                plVar46 = ngs->lastphn_cand;
                iVar21 = ngs->n_lastphn_cand;
                ngs->n_lastphn_cand = iVar21 + 1;
                plVar46[iVar21].wid = iVar15;
                plVar46[iVar21].score = iVar29 - ngs->nwpen;
                plVar46[iVar21].bp = (prVar28->hmm).out_history;
              }
              piVar18 = ngs->homophone_set + lVar44;
            }
          }
        }
        prVar28 = prVar28 + 1;
      }
      pppcVar7 = ngs->active_chan_list;
      local_478 = pppcVar7[local_450];
      iVar34 = (int)((ulong)((long)ppcVar22 - (long)local_478) >> 3);
      ngs->n_active_chan[local_450] = iVar34;
      iVar16 = ngs->best_score;
      iVar33 = ngs->dynamic_beam;
      iVar25 = ngs->pbeam + iVar16;
      iVar14 = iVar16 + ngs->lpbeam;
      ppVar27 = (ngs->base).pls;
      uVar42 = iVar30 & 1;
      local_440 = (ulong)uVar42;
      ppcVar22 = pppcVar7[uVar42];
      local_478 = local_478 + iVar34;
      iVar34 = ngs->n_active_chan[uVar42];
      local_458 = (dict2pid_t *)CONCAT44(local_458._4_4_,iVar25);
      while (0 < iVar34) {
        local_460 = (ps_search_t *)CONCAT44(local_460._4_4_,iVar34);
        pcVar45 = *ppcVar22;
        iVar34 = (pcVar45->hmm).frame;
        if (iVar34 < iVar30) {
          __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x335,"void prune_nonroot_chan(ngram_search_t *, int)");
        }
        if (iVar33 + iVar16 < (pcVar45->hmm).bestscore) {
          if (iVar34 != (int)local_468) {
            (pcVar45->hmm).frame = (int)local_468;
            *local_478 = pcVar45;
            local_478 = local_478 + 1;
          }
          iVar34 = ngs->pip + (pcVar45->hmm).out_score;
          if ((ppVar27 != (ps_search_t *)0x0) || (iVar25 < iVar34)) {
            ppcVar40 = &pcVar45->next;
            while (h = *ppcVar40, h != (chan_t *)0x0) {
              if (ppVar27 == (ps_search_t *)0x0) {
                iVar29 = 0;
              }
              else {
                iVar29 = *(int *)((long)&(ppVar27[1].acmod)->config + (long)h->ciphone * 4);
              }
              if ((iVar25 < iVar29 + iVar34) &&
                 ((iVar29 = (h->hmm).frame, iVar29 < iVar30 || ((h->hmm).score[0] < iVar34)))) {
                if (iVar29 != (int)local_468) {
                  *local_478 = h;
                  local_478 = local_478 + 1;
                }
                hmm_enter(&h->hmm,iVar34,(pcVar45->hmm).out_history,(int)local_468);
                iVar25 = (int)local_458;
              }
              ppcVar40 = &h->alt;
            }
          }
          if ((ppVar27 != (ps_search_t *)0x0) || (iVar14 < iVar34)) {
            paVar19 = &pcVar45->info;
            while( true ) {
              iVar29 = paVar19->penult_phn_wid;
              lVar44 = (long)iVar29;
              if (lVar44 < 0) break;
              if (ppVar27 == (ps_search_t *)0x0) {
                iVar15 = 0;
              }
              else {
                pdVar6 = ((ngs->base).dict)->word;
                iVar15 = *(int *)((long)&(ppVar27[1].acmod)->config +
                                 (long)pdVar6[lVar44].ciphone[(long)pdVar6[lVar44].pronlen + -1] * 4
                                 );
              }
              if (iVar14 < iVar15 + iVar34) {
                plVar46 = ngs->lastphn_cand;
                iVar15 = ngs->n_lastphn_cand;
                ngs->n_lastphn_cand = iVar15 + 1;
                plVar46[iVar15].wid = iVar29;
                plVar46[iVar15].score = iVar34 - ngs->nwpen;
                plVar46[iVar15].bp = (pcVar45->hmm).out_history;
              }
              paVar19 = (anon_union_4_2_fc8632de_for_info *)(ngs->homophone_set + lVar44);
            }
          }
        }
        else if (iVar34 != (int)local_468) {
          hmm_clear(&pcVar45->hmm);
          iVar25 = (int)local_458;
        }
        ppcVar22 = ppcVar22 + 1;
        iVar34 = (int)local_460 + -1;
      }
      uVar32 = (ulong)(uint)((int)local_450 * 8);
      ngs->n_active_chan[local_450] =
           (int32)((ulong)((long)local_478 - *(long *)((long)ngs->active_chan_list + uVar32)) >> 3);
      plVar46 = ngs->lastphn_cand;
      local_480 = *(uint **)((long)ngs->active_word_list + uVar32);
      iVar16 = ngs->n_lastphn_cand;
      piVar18 = &(ngs->st).n_lastphn_cand_utt;
      *piVar18 = *piVar18 + iVar16;
      uVar42 = 0;
      for (iVar33 = 0; iVar33 < iVar16; iVar33 = iVar33 + 1) {
        if ((long)plVar46->bp != -1) {
          pbVar38 = ngs->bp_table + plVar46->bp;
          iVar47 = ngram_search_exit_score
                             (ngs,pbVar38,(int)*((ngs->base).dict)->word[plVar46->wid].ciphone);
          if (iVar47 < -0x1fffffff) {
            __assert_fail("start_score BETTER_THAN WORST_SCORE",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x392,"void last_phone_transition(ngram_search_t *, int)");
          }
          plVar46->score = plVar46->score - iVar47;
          plVar23 = ngs->last_ltrans;
          lVar44 = (long)plVar46->wid;
          iVar16 = pbVar38->frame + 1;
          if (plVar23[lVar44].sf != iVar16) {
            uVar32 = 0;
            if (0 < (int)uVar42) {
              uVar32 = (ulong)uVar42;
            }
            for (uVar31 = 0; uVar32 != uVar31; uVar31 = uVar31 + 1) {
              pcVar20 = ngs->cand_sf;
              if (pcVar20[uVar31].bp_ef == pbVar38->frame) {
                plVar46->next = pcVar20[uVar31].cand;
                goto LAB_00137906;
              }
            }
            iVar16 = ngs->cand_sf_alloc;
            if (iVar16 <= (int)uVar42) {
              if (iVar16 == 0) {
                pcVar20 = (cand_sf_t *)
                          __ckd_calloc__(0x20,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                         ,0x3ab);
                ngs->cand_sf = pcVar20;
                ngs->cand_sf_alloc = 0x20;
              }
              else {
                ngs->cand_sf_alloc = iVar16 + 0x20;
                pcVar20 = (cand_sf_t *)
                          __ckd_realloc__(ngs->cand_sf,(long)iVar16 * 8 + 0x100,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                          ,0x3b2);
                ngs->cand_sf = pcVar20;
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                        ,0x3b4,"cand_sf[] increased to %d entries\n",(ulong)(uint)ngs->cand_sf_alloc
                       );
              }
            }
            plVar46->next = -1;
            iVar16 = pbVar38->frame;
            pcVar20 = ngs->cand_sf;
            uVar31 = (ulong)(int)uVar42;
            uVar42 = uVar42 + 1;
            pcVar20[uVar31].bp_ef = iVar16;
            plVar23 = ngs->last_ltrans;
            lVar44 = (long)plVar46->wid;
            iVar16 = iVar16 + 1;
LAB_00137906:
            pcVar20[uVar31].cand = iVar33;
            plVar23[lVar44].dscr = -0x20000000;
            plVar23[lVar44].sf = iVar16;
          }
        }
        plVar46 = plVar46 + 1;
        iVar16 = ngs->n_lastphn_cand;
      }
      puVar26 = (uint *)0x0;
      local_460 = (ps_search_t *)(ulong)uVar42;
      if ((int)uVar42 < 1) {
        local_460 = (ps_search_t *)puVar26;
      }
      while ((ps_search_t *)puVar26 != local_460) {
        lVar44 = (long)ngs->cand_sf[(long)puVar26].bp_ef;
        uVar32 = (ulong)ngs->bp_table_idx[lVar44];
        iVar16 = ngs->bp_table_idx[lVar44 + 1];
        pbVar38 = ngs->bp_table + uVar32;
        local_458 = (dict2pid_t *)puVar26;
        while (iVar33 = (int)uVar32, iVar33 < iVar16) {
          if (pbVar38->valid != '\0') {
            piVar18 = &ngs->cand_sf[(long)local_458].cand;
            while (lVar44 = (long)*piVar18, -1 < lVar44) {
              plVar46 = ngs->lastphn_cand + lVar44;
              iVar47 = ngram_search_exit_score
                                 (ngs,pbVar38,
                                  (int)*((ngs->base).dict)->word[ngs->lastphn_cand[lVar44].wid].
                                        ciphone);
              if (-0x20000000 < iVar47) {
                iVar34 = dict_filler_word((ngs->base).dict,plVar46->wid);
                if (iVar34 != 0) {
                  __assert_fail("!dict_filler_word(ps_search_dict(ngs), candp->wid)",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x3d5,"void last_phone_transition(ngram_search_t *, int)");
                }
                iVar43 = ngram_tg_score(ngs->lmset,((ngs->base).dict)->word[plVar46->wid].basewid,
                                        pbVar38->real_wid,pbVar38->prev_real_wid,local_438);
                iVar47 = iVar47 + (iVar43 >> 10);
              }
              plVar23 = ngs->last_ltrans;
              iVar34 = plVar46->wid;
              if (plVar23[iVar34].dscr < iVar47) {
                plVar23[iVar34].dscr = iVar47;
                plVar23[iVar34].bp = iVar33;
              }
              piVar18 = &plVar46->next;
            }
          }
          pbVar38 = pbVar38 + 1;
          uVar32 = (ulong)(iVar33 + 1);
        }
        puVar26 = (uint *)((long)local_458 + 1);
      }
      iVar16 = ngs->last_phone_best_score;
      plVar46 = ngs->lastphn_cand;
      iVar33 = ngs->n_lastphn_cand;
      plVar24 = plVar46;
      iVar34 = 0;
      if (0 < iVar33) {
        iVar34 = iVar33;
      }
      while (iVar34 != 0) {
        plVar23 = ngs->last_ltrans;
        iVar25 = plVar24->score + plVar23[plVar24->wid].dscr;
        plVar24->score = iVar25;
        plVar24->bp = plVar23[plVar24->wid].bp;
        if (iVar16 < iVar25) {
          iVar16 = iVar25;
        }
        plVar24 = plVar24 + 1;
        iVar34 = iVar34 + -1;
      }
      ngs->last_phone_best_score = iVar16;
      iVar34 = ngs->lponlybeam;
      for (; 0 < iVar33; iVar33 = iVar33 + -1) {
        if (iVar16 + iVar34 < plVar46->score) {
          uVar42 = plVar46->wid;
          ngram_search_alloc_all_rc(ngs,uVar42);
          local_458 = (dict2pid_t *)(long)(int)uVar42;
          iVar25 = 0;
          for (phVar39 = (hmm_t *)(ngs->word_chan + (long)local_458);
              phVar39 = (hmm_t *)phVar39->ctx, phVar39 != (hmm_t *)0x0; phVar39 = phVar39 + 1) {
            if ((phVar39->frame < iVar30) || (phVar39->score[0] < plVar46->score)) {
              if (phVar39->frame == (int)local_468) {
                __assert_fail("hmm_frame(&hmm->hmm) != nf",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x3fc,"void last_phone_transition(ngram_search_t *, int)");
              }
              hmm_enter(phVar39,plVar46->score,plVar46->bp,(int)local_468);
              iVar25 = iVar25 + 1;
            }
          }
          if (0 < iVar25) {
            pbVar8 = ngs->word_active;
            if ((pbVar8[(int)uVar42 / 0x20] >> (uVar42 & 0x1f) & 1) != 0) {
              __assert_fail("bitvec_is_clear(ngs->word_active, w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x403,"void last_phone_transition(ngram_search_t *, int)");
            }
            if (((ngs->base).dict)->word[(long)local_458].pronlen == 1) {
              __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x404,"void last_phone_transition(ngram_search_t *, int)");
            }
            *local_480 = uVar42;
            local_480 = local_480 + 1;
            puVar26 = pbVar8 + (int)uVar42 / 0x20;
            *puVar26 = *puVar26 | (uint)(1L << ((byte)uVar42 & 0x1f));
          }
        }
        plVar46 = plVar46 + 1;
      }
      ppiVar9 = ngs->active_word_list;
      piVar18 = ppiVar9[local_450];
      iVar16 = (int)((ulong)((long)local_480 - (long)piVar18) >> 2);
      ngs->n_active_word[local_450] = iVar16;
      iVar33 = ngs->wbeam + ngs->last_phone_best_score;
      iVar34 = ngs->last_phone_best_score + ngs->lponlybeam;
      local_448 = (uint *)(piVar18 + iVar16);
      ppVar27 = (ps_search_t *)ppiVar9[local_440];
      for (iVar16 = ngs->n_active_word[local_440]; 0 < iVar16; iVar16 = iVar16 + -1) {
        local_458 = (dict2pid_t *)(ulong)*(uint *)ppVar27;
        local_460 = (ps_search_t *)((long)ppVar27 + 4);
        local_440 = (ulong)(int)*(uint *)ppVar27;
        ppcVar40 = ngs->word_chan + local_440;
        iVar25 = 0;
        pcVar10 = *ppcVar40;
        while (pcVar45 = pcVar10, uVar42 = (uint)local_458, pcVar45 != (chan_t *)0x0) {
          iVar14 = (pcVar45->hmm).frame;
          if (iVar14 < iVar30) {
            __assert_fail("hmm_frame(&hmm->hmm) >= frame_idx",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                          ,0x428,"void prune_word_chan(ngram_search_t *, int)");
          }
          pcVar10 = pcVar45->next;
          if (iVar34 < (pcVar45->hmm).bestscore) {
            ppcVar40 = &pcVar45->next;
            (pcVar45->hmm).frame = (int)local_468;
            iVar25 = iVar25 + 1;
            iVar47 = (pcVar45->hmm).out_score;
            if (iVar33 < iVar47) {
              ngram_search_save_bp
                        (ngs,iVar30,uVar42,iVar47,(pcVar45->hmm).out_history,
                         (pcVar45->info).penult_phn_wid);
            }
          }
          else if (iVar14 == (int)local_468) {
            ppcVar40 = &pcVar45->next;
          }
          else {
            hmm_deinit(&pcVar45->hmm);
            __listelem_free__(ngs->chan_alloc,pcVar45,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                              ,0x43f);
            *ppcVar40 = pcVar10;
          }
        }
        if (iVar25 != 0) {
          pbVar8 = ngs->word_active;
          iVar25 = (int)((long)((ulong)(uint)((int)uVar42 >> 0x1f) << 0x20 |
                               (ulong)local_458 & 0xffffffff) / 0x20);
          if ((pbVar8[iVar25] >> (uVar42 & 0x1f) & 1) == 0) {
            if (((ngs->base).dict)->word[local_440].pronlen == 1) {
              __assert_fail("!dict_is_single_phone(ps_search_dict(ngs), w)",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x444,"void prune_word_chan(ngram_search_t *, int)");
            }
            *local_448 = uVar42;
            local_448 = local_448 + 1;
            puVar26 = pbVar8 + iVar25;
            *puVar26 = *puVar26 | (uint)(1L << ((byte)local_458 & 0x1f));
          }
        }
        ppVar27 = local_460;
      }
      ngs->n_active_word[local_450] =
           (int32)((ulong)((long)local_448 - (long)ngs->active_word_list[local_450]) >> 2);
      for (lVar44 = 0; lVar44 < ngs->n_1ph_words; lVar44 = lVar44 + 1) {
        iVar16 = ngs->single_phone_wid[lVar44];
        pcVar45 = ngs->word_chan[iVar16];
        if ((iVar30 <= (pcVar45->hmm).frame) && (iVar34 < (pcVar45->hmm).bestscore)) {
          (pcVar45->hmm).frame = (int)local_468;
          iVar47 = (pcVar45->hmm).out_score;
          if (iVar33 < iVar47) {
            ngram_search_save_bp(ngs,iVar30,iVar16,iVar47,(pcVar45->hmm).out_history,0);
          }
        }
      }
      local_480._0_4_ = frame_idx_local;
      if ((ngs->maxwpf != -1) && (ngs->maxwpf != (ngs->base).n_words)) {
        local_468 = (ulong)frame_idx_local;
        lVar36 = (long)ngs->bp_table_idx[local_468];
        lVar41 = lVar36 * 0x24;
        iVar16 = -0x80000000;
        iVar33 = 0;
        lVar44 = 0;
        while( true ) {
          iVar34 = ngs->bpidx;
          if (iVar34 <= lVar36) break;
          pbVar38 = ngs->bp_table;
          iVar34 = dict_filler_word((ngs->base).dict,*(s3wid_t *)((long)&pbVar38->wid + lVar41));
          if (iVar34 != 0) {
            iVar34 = *(int *)((long)&pbVar38->score + lVar41);
            if (iVar16 < iVar34) {
              lVar44 = (long)&pbVar38->frame + lVar41;
              iVar16 = iVar34;
            }
            (&pbVar38->valid)[lVar41] = '\0';
            iVar33 = iVar33 + 1;
          }
          lVar36 = lVar36 + 1;
          lVar41 = lVar41 + 0x24;
        }
        if (lVar44 != 0) {
          *(undefined1 *)(lVar44 + 4) = 1;
          iVar33 = iVar33 + -1;
        }
        iVar16 = ngs->bp_table_idx[local_468];
        iVar25 = ngs->maxwpf;
        for (iVar33 = iVar34 - (iVar33 + iVar16); iVar25 < iVar33; iVar33 = iVar33 + -1) {
          iVar30 = 0x7fffffff;
          lVar44 = 0;
          lVar36 = (long)iVar16 * 0x24;
          for (lVar41 = (long)iVar16; lVar41 < iVar34; lVar41 = lVar41 + 1) {
            pbVar38 = ngs->bp_table;
            if ((&pbVar38->valid)[lVar36] != '\0') {
              iVar14 = *(int *)((long)&pbVar38->score + lVar36);
              if (iVar14 < iVar30) {
                lVar44 = (long)&pbVar38->frame + lVar36;
                iVar30 = iVar14;
              }
            }
            lVar36 = lVar36 + 0x24;
          }
          if (lVar44 == 0) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                    ,0x4d3,"PANIC: No worst BPtable entry remaining\n");
            exit(1);
          }
          *(undefined1 *)(lVar44 + 4) = 0;
        }
        local_480._0_4_ = frame_idx_local;
      }
      pdVar11 = (ngs->base).dict;
      local_458 = (ngs->base).d2p;
      pbVar12 = ((ngs->base).acmod)->mdef;
      uVar32 = (ulong)(uint)pbVar12->n_ciphone;
      lVar44 = uVar32 * 0xc;
      while( true ) {
        if ((int)uVar32 < 1) break;
        *(undefined4 *)((long)&ngs->bestbp_rc[-1].score + lVar44) = 0xe0000000;
        uVar32 = (ulong)((int)uVar32 - 1);
        lVar44 = lVar44 + -0xc;
      }
      ppVar27 = (ngs->base).pls;
      iVar16 = 0;
      for (lVar44 = (long)ngs->bp_table_idx[(int)local_480]; lVar44 < ngs->bpidx;
          lVar44 = lVar44 + 1) {
        pbVar38 = ngs->bp_table;
        ngs->word_lat_idx[pbVar38[lVar44].wid] = -1;
        if (pbVar38[lVar44].wid != (ngs->base).finish_wid) {
          iVar16 = iVar16 + 1;
          sVar1 = pbVar38[lVar44].last2_phone;
          if ((long)sVar1 == -1) {
            uVar32 = (ulong)(uint)pbVar12->n_ciphone;
            if (pbVar12->n_ciphone < 1) {
              uVar32 = 0;
            }
            for (lVar36 = 0; uVar32 * 0xc - lVar36 != 0; lVar36 = lVar36 + 0xc) {
              pbVar48 = ngs->bestbp_rc;
              if (*(int *)((long)&pbVar48->score + lVar36) < pbVar38[lVar44].score) {
                *(int32 *)((long)&pbVar48->score + lVar36) = pbVar38[lVar44].score;
                *(int *)((long)&pbVar48->path + lVar36) = (int)lVar44;
                *(int *)((long)&pbVar48->lc + lVar36) = (int)pbVar38[lVar44].last_phone;
              }
            }
          }
          else {
            sVar2 = pbVar38[lVar44].last_phone;
            pxVar13 = local_458->rssid[(int)sVar2];
            iVar33 = pbVar38[lVar44].s_idx;
            piVar18 = ngs->bscore_stack;
            uVar32 = (ulong)(uint)pbVar12->n_ciphone;
            if (pbVar12->n_ciphone < 1) {
              uVar32 = 0;
            }
            lVar36 = 8;
            for (uVar31 = 0; uVar32 != uVar31; uVar31 = uVar31 + 1) {
              pbVar48 = ngs->bestbp_rc;
              if (*(int *)((long)pbVar48 + lVar36 + -8) <
                  piVar18[(long)iVar33 + (long)pxVar13[sVar1].cimap[uVar31]]) {
                *(int32 *)((long)pbVar48 + lVar36 + -8) =
                     piVar18[(long)iVar33 + (long)pxVar13[sVar1].cimap[uVar31]];
                *(int *)((long)pbVar48 + lVar36 + -4) = (int)lVar44;
                *(int *)((long)&pbVar48->score + lVar36) = (int)sVar2;
              }
              lVar36 = lVar36 + 0xc;
            }
          }
        }
      }
      iVar33 = ngs->n_root_chan;
      prVar28 = ngs->root_chan;
      frame_idx_local = (int)local_480;
      local_460 = ppVar27;
      if (iVar16 != 0) {
        iVar16 = (int)local_480 + 1;
        iVar34 = ngs->dynamic_beam + ngs->best_score;
        for (; 0 < iVar33; iVar33 = iVar33 + -1) {
          lVar44 = (long)prVar28->ciphone;
          if (ppVar27 == (ps_search_t *)0x0) {
            iVar25 = 0;
          }
          else {
            iVar25 = *(int *)((long)&(ppVar27[1].acmod)->config + lVar44 * 4);
          }
          pbVar48 = ngs->bestbp_rc;
          iVar30 = ngs->nwpen + pbVar48[lVar44].score + ngs->pip;
          if ((iVar34 < iVar25 + iVar30) &&
             (((prVar28->hmm).frame < (int)local_480 || ((prVar28->hmm).score[0] < iVar30)))) {
            hmm_enter(&prVar28->hmm,iVar30,pbVar48[lVar44].path,iVar16);
            sVar3 = local_458->ldiph_lc[prVar28->ciphone][prVar28->ci2phone][pbVar48[lVar44].lc];
            (prVar28->hmm).senid[0] = sVar3;
            ppVar27 = local_460;
            if (sVar3 == 0xffff) {
              __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                            ,0x52e,"void word_transition(ngram_search_t *, int)");
            }
          }
          prVar28 = prVar28 + 1;
        }
        uVar42 = ngs->n_1ph_LMwords;
        uVar32 = 0;
        uVar31 = 0;
        if (0 < (int)uVar42) {
          uVar31 = (ulong)uVar42;
        }
        for (; uVar31 != uVar32; uVar32 = uVar32 + 1) {
          ngs->last_ltrans[ngs->single_phone_wid[uVar32]].dscr = -0x80000000;
        }
        lVar44 = (long)ngs->bp_table_idx[(int)local_480];
        while (lVar44 < ngs->bpidx) {
          local_468 = lVar44;
          if (ngs->bp_table[lVar44].valid != '\0') {
            pbVar38 = ngs->bp_table + lVar44;
            for (lVar44 = 0; lVar44 < (int)uVar42; lVar44 = lVar44 + 1) {
              iVar33 = ngs->single_phone_wid[lVar44];
              iVar47 = ngram_search_exit_score(ngs,pbVar38,(int)*pdVar11->word[iVar33].ciphone);
              iVar25 = -0x20000000;
              if (iVar47 != -0x20000000) {
                iVar43 = ngram_tg_score(ngs->lmset,pdVar11->word[iVar33].basewid,pbVar38->real_wid,
                                        pbVar38->prev_real_wid,local_438);
                iVar25 = (iVar43 >> 10) + iVar47;
              }
              plVar23 = ngs->last_ltrans;
              if (plVar23[iVar33].dscr < iVar25) {
                plVar23[iVar33].dscr = iVar25;
                plVar23[iVar33].bp = (int32)local_468;
              }
              uVar42 = ngs->n_1ph_LMwords;
            }
          }
          lVar44 = local_468 + 1;
        }
        for (lVar44 = 0; lVar44 < (int)uVar42; lVar44 = lVar44 + 1) {
          iVar33 = ngs->single_phone_wid[lVar44];
          if (iVar33 != ((ngs->base).dict)->startwid) {
            pcVar45 = ngs->word_chan[iVar33];
            if (local_460 == (ps_search_t *)0x0) {
              iVar25 = 0;
            }
            else {
              iVar25 = *(int *)((long)&(local_460[1].acmod)->config +
                               (long)(short)pcVar45->ciphone * 4);
            }
            iVar30 = ngs->pip + ngs->last_ltrans[iVar33].dscr;
            if (iVar34 < iVar25 + iVar30) {
              pbVar38 = ngs->bp_table;
              iVar33 = ngs->last_ltrans[iVar33].bp;
              if (((pcVar45->hmm).frame < (int)local_480) || ((pcVar45->hmm).score[0] < iVar30)) {
                hmm_enter(&pcVar45->hmm,iVar30,iVar33,iVar16);
                iVar33 = pbVar38[iVar33].wid;
                uVar4 = local_458->ldiph_lc[(short)pcVar45->ciphone]
                        [*(short *)((long)&pcVar45->ciphone + 2)]
                        [pdVar11->word[iVar33].ciphone[(long)pdVar11->word[iVar33].pronlen + -1]];
                (pcVar45->hmm).senid[0] = uVar4;
                if (uVar4 == 0xffff) {
                  __assert_fail("hmm_mpx_ssid(&rhmm->hmm, 0) != BAD_SSID",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search_fwdtree.c"
                                ,0x56c,"void word_transition(ngram_search_t *, int)");
                }
                uVar42 = ngs->n_1ph_LMwords;
              }
            }
          }
        }
        iVar33 = ((ngs->base).acmod)->mdef->sil;
        iVar25 = ngs->silpen + ngs->bestbp_rc[iVar33].score + ngs->pip;
        pcVar45 = ngs->word_chan[(ngs->base).silence_wid];
        if (local_460 == (ps_search_t *)0x0) {
          iVar30 = 0;
        }
        else {
          iVar30 = *(int *)((long)&(local_460[1].acmod)->config + (long)(short)pcVar45->ciphone * 4)
          ;
        }
        pbVar48 = ngs->bestbp_rc + iVar33;
        if ((iVar34 < iVar30 + iVar25) &&
           (((pcVar45->hmm).frame < (int)local_480 || ((pcVar45->hmm).score[0] < iVar25)))) {
          hmm_enter(&pcVar45->hmm,iVar25,pbVar48->path,iVar16);
        }
        ppVar27 = local_460;
        for (lVar44 = (long)pdVar11->filler_start; lVar44 <= pdVar11->filler_end;
            lVar44 = lVar44 + 1) {
          if ((((int)lVar44 != (ngs->base).silence_wid) &&
              ((int)lVar44 != ((ngs->base).dict)->startwid)) &&
             (pcVar45 = ngs->word_chan[lVar44], pcVar45 != (chan_t *)0x0)) {
            if (ppVar27 == (ps_search_t *)0x0) {
              iVar33 = 0;
            }
            else {
              iVar33 = *(int *)((long)&(ppVar27[1].acmod)->config +
                               (long)(short)pcVar45->ciphone * 4);
            }
            iVar25 = ngs->fillpen + pbVar48->score + ngs->pip;
            if ((iVar34 < iVar33 + iVar25) &&
               (((pcVar45->hmm).frame < (int)local_480 || ((pcVar45->hmm).score[0] < iVar25)))) {
              hmm_enter(&pcVar45->hmm,iVar25,pbVar48->path,iVar16);
              ppVar27 = local_460;
            }
          }
        }
        iVar33 = ngs->n_root_chan;
        prVar28 = ngs->root_chan;
        local_480._0_4_ = frame_idx_local;
      }
      for (; 0 < iVar33; iVar33 = iVar33 + -1) {
        if ((prVar28->hmm).frame == (int)local_480) {
          hmm_clear(&prVar28->hmm);
        }
        prVar28 = prVar28 + 1;
      }
      for (lVar44 = 0; lVar44 < ngs->n_1ph_words; lVar44 = lVar44 + 1) {
        if ((ngs->word_chan[ngs->single_phone_wid[lVar44]]->hmm).frame == (int)local_480) {
          hmm_clear(&ngs->word_chan[ngs->single_phone_wid[lVar44]]->hmm);
        }
      }
      ngs->n_frame = ngs->n_frame + 1;
      iVar16 = 1;
    }
  }
  return iVar16;
}

Assistant:

int
ngram_fwdtree_search(ngram_search_t *ngs, int frame_idx)
{
    int16 const *senscr;

    /* Activate our HMMs for the current frame if need be. */
    if (!ps_search_acmod(ngs)->compallsen)
        compute_sen_active(ngs, frame_idx);

    /* Compute GMM scores for the current frame. */
    if ((senscr = acmod_score(ps_search_acmod(ngs), &frame_idx)) == NULL)
        return 0;
    ngs->st.n_senone_active_utt += ps_search_acmod(ngs)->n_senone_active;

    /* Mark backpointer table for current frame. */
    ngram_search_mark_bptable(ngs, frame_idx);

    /* If the best score is equal to or worse than WORST_SCORE,
     * recognition has failed, don't bother to keep trying. */
    if (ngs->best_score == WORST_SCORE || ngs->best_score WORSE_THAN WORST_SCORE)
        return 0;
    /* Renormalize if necessary */
    if (ngs->best_score + (2 * ngs->beam) WORSE_THAN WORST_SCORE) {
        E_INFO("Renormalizing Scores at frame %d, best score %d\n",
               frame_idx, ngs->best_score);
        renormalize_scores(ngs, frame_idx, ngs->best_score);
    }

    /* Evaluate HMMs */
    evaluate_channels(ngs, senscr, frame_idx);
    /* Prune HMMs and do phone transitions. */
    prune_channels(ngs, frame_idx);
    /* Do absolute pruning on word exits. */
    bptable_maxwpf(ngs, frame_idx);
    /* Do word transitions. */
    word_transition(ngs, frame_idx);
    /* Deactivate pruned HMMs. */
    deactivate_channels(ngs, frame_idx);

    ++ngs->n_frame;
    /* Return the number of frames processed. */
    return 1;
}